

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_arg * __thiscall
fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::
arg(basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> *this,
   basic_string_view<char> name)

{
  basic_string_view<char> name_00;
  type tVar1;
  char *in_RCX;
  arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_RDX;
  long in_RSI;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> *in_RDI;
  size_t unaff_retaddr;
  char *in_stack_ffffffffffffffb8;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> *this_00;
  
  this_00 = in_RDI;
  internal::
  arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  ::init((arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)(in_RSI + 0x18),(EVP_PKEY_CTX *)(in_RSI + 8));
  name_00.size_ = unaff_retaddr;
  name_00.data_ = in_RCX;
  internal::
  arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  ::find(in_RDX,name_00);
  tVar1 = basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          ::type((basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                  *)in_RDI);
  if (tVar1 == none_type) {
    on_error(this_00,in_stack_ffffffffffffffb8);
  }
  return (format_arg *)this_00;
}

Assistant:

typename basic_format_context<Range, Char>::format_arg
basic_format_context<Range, Char>::arg(basic_string_view<char_type> name) {
  map_.init(args_);
  format_arg arg = map_.find(name);
  if (arg.type() == internal::none_type) this->on_error("argument not found");
  return arg;
}